

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecordQuerySpecification.cpp
# Opt level: O0

void __thiscall
DIS::RecordQuerySpecification::marshal(RecordQuerySpecification *this,DataStream *dataStream)

{
  undefined8 uVar1;
  size_type sVar2;
  const_reference pvVar3;
  undefined1 local_30 [8];
  FourByteChunk x;
  size_t idx;
  DataStream *dataStream_local;
  RecordQuerySpecification *this_local;
  
  sVar2 = std::vector<DIS::FourByteChunk,_std::allocator<DIS::FourByteChunk>_>::size
                    (&this->_records);
  DataStream::operator<<(dataStream,(uint)sVar2);
  x._otherParameters[0] = '\0';
  x._otherParameters[1] = '\0';
  x._otherParameters[2] = '\0';
  x._otherParameters[3] = '\0';
  x._12_4_ = 0;
  while( true ) {
    uVar1 = x._8_8_;
    sVar2 = std::vector<DIS::FourByteChunk,_std::allocator<DIS::FourByteChunk>_>::size
                      (&this->_records);
    if (sVar2 <= (ulong)uVar1) break;
    pvVar3 = std::vector<DIS::FourByteChunk,_std::allocator<DIS::FourByteChunk>_>::operator[]
                       (&this->_records,x._8_8_);
    FourByteChunk::FourByteChunk((FourByteChunk *)local_30,pvVar3);
    FourByteChunk::marshal((FourByteChunk *)local_30,dataStream);
    FourByteChunk::~FourByteChunk((FourByteChunk *)local_30);
    x._8_8_ = x._8_8_ + 1;
  }
  return;
}

Assistant:

void RecordQuerySpecification::marshal(DataStream& dataStream) const
{
    dataStream << ( unsigned int )_records.size();

     for(size_t idx = 0; idx < _records.size(); idx++)
     {
        FourByteChunk x = _records[idx];
        x.marshal(dataStream);
     }

}